

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

void * uhash_removeElement_63(UHashtable *hash,UHashElement *e)

{
  UHashTok UVar1;
  
  if (-1 < e->hashcode) {
    hash->count = hash->count + -1;
    UVar1 = _uhash_setElement(hash,e,-0x80000000,(UHashTok)0x0,(UHashTok)0x0,'\0');
    return UVar1.pointer;
  }
  return (void *)0x0;
}

Assistant:

U_CAPI void* U_EXPORT2
uhash_removeElement(UHashtable *hash, const UHashElement* e) {
    U_ASSERT(hash != NULL);
    U_ASSERT(e != NULL);
    if (!IS_EMPTY_OR_DELETED(e->hashcode)) {
        UHashElement *nce = (UHashElement *)e;
        return _uhash_internalRemoveElement(hash, nce).pointer;
    }
    return NULL;
}